

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O2

Variant * __thiscall Jinx::Variant::operator++(Variant *this)

{
  ValueType VVar1;
  
  VVar1 = this->m_type;
  if (VVar1 == CollectionItr) {
    std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_> *)
               &(this->field_1).m_string);
  }
  else if (VVar1 == Integer) {
    (this->field_1).m_collection.
    super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              &(((this->field_1).m_collection.
                 super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_M_t)._M_impl.field_0x1;
  }
  else if (VVar1 == Number) {
    (this->field_1).m_number = (this->field_1).m_number + 1.0;
  }
  return this;
}

Assistant:

inline_t Variant & Variant::operator ++()
	{
		switch (m_type)
		{
			case ValueType::Number:
				++m_number;
				break;
			case ValueType::Integer:
				++m_integer;
				break;
			case ValueType::CollectionItr:
				++m_collectionItrPair.first;
				break;
			default:
				break;
		};
		return *this;
	}